

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O0

void threadsafe_mem_leak_operator_delete_array(void *mem)

{
  MemoryLeakDetector *allocator;
  MemoryLeakDetector *memory;
  TestMemoryAllocator *pTVar1;
  MemLeakScopedMutex lock;
  char *in_stack_ffffffffffffffd8;
  MemoryLeakDetector *in_stack_ffffffffffffffe0;
  MemoryLeakDetector *in_stack_fffffffffffffff0;
  
  MemLeakScopedMutex::MemLeakScopedMutex((MemLeakScopedMutex *)in_stack_ffffffffffffffe0);
  allocator = MemoryLeakWarningPlugin::getGlobalDetector();
  MemoryLeakDetector::invalidateMemory(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  memory = MemoryLeakWarningPlugin::getGlobalDetector();
  pTVar1 = getCurrentNewArrayAllocator();
  MemoryLeakDetector::deallocMemory
            (in_stack_fffffffffffffff0,(TestMemoryAllocator *)allocator,memory,
             SUB81((ulong)pTVar1 >> 0x38,0));
  MemLeakScopedMutex::~MemLeakScopedMutex((MemLeakScopedMutex *)0x10e03a);
  return;
}

Assistant:

static void threadsafe_mem_leak_operator_delete_array (void* mem) UT_NOTHROW
{
    MemLeakScopedMutex lock;
    MemoryLeakWarningPlugin::getGlobalDetector()->invalidateMemory((char*) mem);
    MemoryLeakWarningPlugin::getGlobalDetector()->deallocMemory(getCurrentNewArrayAllocator(), (char*) mem);
}